

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

Vec_Int_t *
Abc_NtkFinCheckPair(Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,
                   Vec_Int_t *vNodes,int *iObjs,int *Types,Vec_Int_t *vLits)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Gia_Man_t *pGia;
  Cnf_Dat_t *p;
  sat_solver *s;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  
  pGia = Abc_NtkFinMiterToGia(pNtk,vTypes,vCos,vCis,vNodes,iObjs,Types,vLits);
  iVar1 = pGia->vCos->nSize;
  if (pGia->nObjs == pGia->vCis->nSize + iVar1 + 1) {
    if (iVar1 < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar1 = *pGia->vCos->pArray;
    if (((long)iVar1 < 0) || (pGia->nObjs <= iVar1)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar3 = (uint)*(undefined8 *)(pGia->pObjs + iVar1);
    if ((~*(ulong *)(pGia->pObjs + iVar1 + -(ulong)(uVar3 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0)
    {
      if ((uVar3 >> 0x1d & 1) == 0) {
        pVVar5 = (Vec_Int_t *)0x0;
      }
      else {
        iVar1 = vCis->nSize;
        pVVar5 = (Vec_Int_t *)malloc(0x10);
        iVar8 = 0x10;
        if (0xe < iVar1 - 1U) {
          iVar8 = iVar1;
        }
        pVVar5->nSize = 0;
        pVVar5->nCap = iVar8;
        if (iVar8 == 0) {
          piVar6 = (int *)0x0;
        }
        else {
          piVar6 = (int *)malloc((long)iVar8 << 2);
        }
        pVVar5->pArray = piVar6;
        pVVar5->nSize = iVar1;
        if (piVar6 != (int *)0x0) {
          memset(piVar6,0,(long)iVar1 << 2);
        }
      }
      Gia_ManStop(pGia);
      return pVVar5;
    }
  }
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  if (s == (sat_solver *)0x0) {
    Gia_ManStop(pGia);
    Cnf_DataFree(p);
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    iVar1 = p->nVars;
    iVar8 = pGia->vCis->nSize;
    iVar2 = pGia->nRegs;
    Gia_ManStop(pGia);
    Cnf_DataFree(p);
    pVVar5 = (Vec_Int_t *)0x0;
    iVar4 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,10000,0,0,0);
    if (iVar4 == 1) {
      iVar4 = vCis->nSize;
      pVVar5 = (Vec_Int_t *)malloc(0x10);
      iVar7 = 0x10;
      if (0xe < iVar4 - 1U) {
        iVar7 = iVar4;
      }
      pVVar5->nSize = 0;
      pVVar5->nCap = iVar7;
      if (iVar7 == 0) {
        piVar6 = (int *)0x0;
      }
      else {
        piVar6 = (int *)malloc((long)iVar7 << 2);
      }
      pVVar5->pArray = piVar6;
      if (0 < vCis->nSize) {
        uVar10 = (ulong)(uint)((iVar1 - iVar8) + iVar2);
        lVar9 = 0;
        do {
          if (((int)uVar10 < 0) || (s->size <= ((iVar2 + iVar1) - iVar8) + (int)lVar9)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          Vec_IntPush(pVVar5,(uint)(s->model[uVar10] == 1));
          lVar9 = lVar9 + 1;
          uVar10 = uVar10 + 1;
        } while (lVar9 < vCis->nSize);
      }
    }
    else if (iVar4 == 0) {
      pVVar5 = (Vec_Int_t *)malloc(0x10);
      pVVar5->nCap = 0;
      pVVar5->nSize = 0;
      pVVar5->pArray = (int *)0x0;
    }
    sat_solver_delete(s);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkFinCheckPair( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, int iObjs[2], int Types[2], Vec_Int_t * vLits )
{
    Gia_Man_t * pGia = Abc_NtkFinMiterToGia( pNtk, vTypes, vCos, vCis, vNodes, iObjs, Types, vLits );
    if ( Gia_ManAndNum(pGia) == 0 && Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManCo(pGia, 0))) )
    {
        Vec_Int_t * vPat = Gia_ObjFaninC0(Gia_ManCo(pGia, 0)) ? Vec_IntStart(Vec_IntSize(vCis)) : NULL;
        Gia_ManStop( pGia );
        return vPat;
    }
    else
    {
        Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
        sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        if ( pSat == NULL )
        {
            Gia_ManStop( pGia );
            Cnf_DataFree( pCnf );
            return NULL;
        }
        else
        {
            int i, nConfLimit = 10000;
            Vec_Int_t * vPat = NULL;
            int status, iVarBeg = pCnf->nVars - Gia_ManPiNum(pGia);// - 1;
            //Gia_AigerWrite( pGia, "temp_detect.aig", 0, 0, 0 );
            Gia_ManStop( pGia );
            Cnf_DataFree( pCnf );
            status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
            if ( status == l_Undef )
                vPat = Vec_IntAlloc(0);
            else if ( status == l_True )
            {
                vPat = Vec_IntAlloc( Vec_IntSize(vCis) );
                for ( i = 0; i < Vec_IntSize(vCis); i++ )
                    Vec_IntPush( vPat, sat_solver_var_value(pSat, iVarBeg+i) );
            }
            //printf( "%d ", sat_solver_nconflicts(pSat) );
            sat_solver_delete( pSat );
            return vPat;
        }
    }
}